

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

void Of_ManComputeBackward2(Of_Man_t *p)

{
  int iVar1;
  Jf_Par_t *pJVar2;
  Of_Obj_t *pOVar3;
  int iVar4;
  uint uVar5;
  Gia_Obj_t *pObj;
  uint *pCut;
  uint uVar6;
  int iVar7;
  uint v;
  
  iVar1 = p->pPars->nDelayLut1;
  Of_ManComputeOutputRequired(p,0);
  pJVar2 = p->pPars;
  pJVar2->Area = 0;
  pJVar2->Edge = 0;
  v = p->pGia->nObjs;
  do {
    do {
      while( true ) {
        do {
          if ((int)v < 2) {
            return;
          }
          v = v - 1;
          pObj = Gia_ManObj(p->pGia,v);
          if (pObj == (Gia_Obj_t *)0x0) {
            return;
          }
          uVar6 = (uint)*(undefined8 *)pObj;
        } while ((~uVar6 & 0x1fffffff) == 0 || (int)uVar6 < 0);
        pOVar3 = p->pObjs;
        iVar7 = pOVar3[v].Required;
        iVar4 = Gia_ObjIsBuf(pObj);
        if (iVar4 == 0) break;
        iVar4 = v - (uVar6 & 0x1fffffff);
        if (iVar7 < pOVar3[iVar4].Required) {
          pOVar3[iVar4].Required = iVar7;
        }
      }
    } while (pOVar3[v].nRefs == 0);
    pCut = (uint *)Of_ObjCutBestP(p,v);
    iVar7 = iVar7 - iVar1;
    for (uVar6 = 0; uVar5 = *pCut & 0x1f, uVar6 < uVar5; uVar6 = uVar6 + 1) {
      uVar5 = Of_CutVar((int *)pCut,uVar6);
      if (uVar5 == 0) {
        uVar5 = *pCut & 0x1f;
        break;
      }
      if (iVar7 < p->pObjs[uVar5].Required) {
        p->pObjs[uVar5].Required = iVar7;
      }
    }
    pJVar2 = p->pPars;
    pJVar2->Area = pJVar2->Area + 1;
    pJVar2->Edge = (ulong)uVar5 + pJVar2->Edge;
  } while( true );
}

Assistant:

void Of_ManComputeBackward2( Of_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int DelayLut1 = p->pPars->nDelayLut1;
    int i, k, iVar, * pCutMin;
    Of_ManComputeOutputRequired( p, 0 );
    // compute area and edges
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        int Required = Of_ObjRequired(p, i);
        if ( Gia_ObjIsBuf(pObj) )
        {
            int FaninId = Gia_ObjFaninId0(pObj, i);
            Of_ObjUpdateRequired( p, FaninId, Required );
            continue;
        }
        if ( !Of_ObjRefNum(p, i) )
            continue;
        // lookup for the cut
        pCutMin = Of_ObjCutBestP( p, i );
        Of_CutForEachVar( pCutMin, iVar, k )
            Of_ObjUpdateRequired( p, iVar, Required - DelayLut1 );
        // update parameters
        p->pPars->Edge += Of_CutSize(pCutMin);
        p->pPars->Area++;
    }
}